

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemView::edit
          (QAbstractItemView *this,QModelIndex *index,EditTrigger trigger,QEvent *event)

{
  bool bVar1;
  FocusPolicy FVar2;
  QAbstractItemViewPrivate *pQVar3;
  QAbstractItemViewPrivate *this_00;
  ulong uVar4;
  EditTrigger in_EDX;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  QWidget *w;
  QAbstractItemViewPrivate *d;
  EditTriggers lastTrigger;
  QPersistentModelIndex safeIndex;
  EditTrigger in_stack_fffffffffffffefc;
  EditTrigger rhs;
  QModelIndex *in_stack_ffffffffffffff00;
  QModelIndex *in_stack_ffffffffffffff08;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff10;
  QBasicTimer *this_01;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff18;
  QAbstractItemViewPrivate *this_02;
  EditTrigger trigger_00;
  QModelIndex *in_stack_ffffffffffffff20;
  QAbstractItemViewPrivate *this_03;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  EditTrigger msec;
  bool local_81;
  QPersistentModelIndex local_80 [3];
  undefined4 local_64;
  QPersistentModelIndex local_60 [3];
  undefined1 local_48 [28];
  undefined4 local_2c;
  QPersistentModelIndex local_28 [3];
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x809abe);
  bVar1 = QAbstractItemViewPrivate::isIndexValid
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    bVar1 = QSet<QWidget_*>::isEmpty((QSet<QWidget_*> *)0x809af4);
    if (bVar1) {
      this_00 = (QAbstractItemViewPrivate *)0x0;
    }
    else {
      QAbstractItemViewPrivate::editorForIndex
                (in_stack_ffffffffffffff18,(QModelIndex *)in_stack_ffffffffffffff10);
      this_00 = (QAbstractItemViewPrivate *)QPointer<QWidget>::data((QPointer<QWidget> *)0x809b1a);
    }
    if (this_00 == (QAbstractItemViewPrivate *)0x0) {
      if (in_EDX == DoubleClicked) {
        QBasicTimer::stop();
        QBasicTimer::stop();
      }
      else if (in_EDX == CurrentChanged) {
        QBasicTimer::stop();
      }
      local_10.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex(&local_10,in_RSI);
      bVar1 = QAbstractItemViewPrivate::sendDelegateEvent
                        ((QAbstractItemViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         in_stack_ffffffffffffff20,(QEvent *)in_stack_ffffffffffffff18);
      if (bVar1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
        update((QAbstractItemView *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        local_81 = true;
      }
      else {
        uVar4 = QPersistentModelIndex::isValid();
        if ((uVar4 & 1) == 0) {
          local_81 = false;
        }
        else {
          local_2c = 0xaaaaaaaa;
          QFlags<QAbstractItemView::EditTrigger>::QFlags
                    ((QFlags<QAbstractItemView::EditTrigger> *)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffefc);
          rhs = (EditTrigger)in_stack_ffffffffffffff00;
          pQVar3->lastTrigger = in_EDX;
          this_02 = (QAbstractItemViewPrivate *)pQVar3->model;
          this_03 = pQVar3;
          msec = in_EDX;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_60);
          (**(code **)(*(long *)&(this_02->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x148))(local_48,this_02,local_60);
          bVar1 = QAbstractItemViewPrivate::shouldEdit
                            (this_02,(EditTrigger)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                             in_stack_ffffffffffffff08);
          trigger_00 = (EditTrigger)((ulong)this_02 >> 0x20);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = QBasicTimer::isActive(&pQVar3->delayedEditing);
            if (bVar1) {
              local_81 = false;
            }
            else {
              local_64 = local_2c;
              bVar1 = ::operator==((QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>)
                                   SUB84((ulong)in_stack_ffffffffffffff08 >> 0x20,0),rhs);
              if ((bVar1) && (in_EDX == SelectedClicked)) {
                local_81 = false;
              }
              else {
                if (in_EDX == SelectedClicked) {
                  this_01 = &pQVar3->delayedEditing;
                  QApplication::doubleClickInterval();
                  QBasicTimer::start(this_01,msec,(QObject *)in_stack_ffffffffffffff08);
                }
                else {
                  QPersistentModelIndex::operator_cast_to_QModelIndex(local_80);
                  QAbstractItemViewPrivate::shouldForwardEvent
                            (this_03,trigger_00,(QEvent *)in_stack_ffffffffffffff10);
                  QAbstractItemViewPrivate::openEditor
                            (this_00,(QModelIndex *)CONCAT44(msec,in_stack_ffffffffffffff28),
                             (QEvent *)this_03);
                }
                local_81 = true;
              }
            }
          }
          else {
            local_81 = false;
          }
        }
      }
      QPersistentModelIndex::~QPersistentModelIndex(&local_10);
    }
    else {
      FVar2 = QWidget::focusPolicy((QWidget *)this_00);
      if (FVar2 == NoFocus) {
        local_81 = false;
      }
      else {
        if ((pQVar3->waitForIMCommit & 1U) == 0) {
          QWidget::setFocus((QWidget *)0x809b65);
        }
        else {
          QWidget::updateMicroFocus
                    ((QWidget *)in_stack_ffffffffffffff10,
                     (InputMethodQuery)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        }
        local_81 = true;
      }
    }
  }
  else {
    local_81 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_81;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemView::edit(const QModelIndex &index, EditTrigger trigger, QEvent *event)
{
    Q_D(QAbstractItemView);

    if (!d->isIndexValid(index))
        return false;

    if (QWidget *w = (d->persistent.isEmpty() ? static_cast<QWidget*>(nullptr) : d->editorForIndex(index).widget.data())) {
        if (w->focusPolicy() == Qt::NoFocus)
            return false;
        if (!d->waitForIMCommit)
            w->setFocus();
        else
            updateMicroFocus();
        return true;
    }

    if (trigger == DoubleClicked) {
        d->delayedEditing.stop();
        d->delayedAutoScroll.stop();
    } else if (trigger == CurrentChanged) {
        d->delayedEditing.stop();
    }

    // in case e.g. setData() triggers a reset()
    QPersistentModelIndex safeIndex(index);

    if (d->sendDelegateEvent(index, event)) {
        update(safeIndex);
        return true;
    }

    if (!safeIndex.isValid()) {
        return false;
    }

    // save the previous trigger before updating
    EditTriggers lastTrigger = d->lastTrigger;
    d->lastTrigger = trigger;

    if (!d->shouldEdit(trigger, d->model->buddy(safeIndex)))
        return false;

    if (d->delayedEditing.isActive())
        return false;

    // we will receive a mouseButtonReleaseEvent after a
    // mouseDoubleClickEvent, so we need to check the previous trigger
    if (lastTrigger == DoubleClicked && trigger == SelectedClicked)
        return false;

    // we may get a double click event later
    if (trigger == SelectedClicked)
        d->delayedEditing.start(QApplication::doubleClickInterval(), this);
    else
        d->openEditor(safeIndex, d->shouldForwardEvent(trigger, event) ? event : nullptr);

    return true;
}